

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reshape.cpp
# Opt level: O2

int __thiscall ncnn::Reshape::load_param(Reshape *this,ParamDict *pd)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = ParamDict::get(pd,0,-0xe9);
  this->w = iVar1;
  iVar1 = ParamDict::get(pd,1,-0xe9);
  this->h = iVar1;
  iVar1 = ParamDict::get(pd,2,-0xe9);
  this->c = iVar1;
  iVar1 = ParamDict::get(pd,3,0);
  this->permute = iVar1;
  uVar2 = this->c == -0xe9 ^ 3;
  if (this->h == -0xe9) {
    uVar2 = 1;
  }
  if (this->w == -0xe9) {
    uVar2 = 0;
  }
  this->ndim = uVar2;
  return 0;
}

Assistant:

int Reshape::load_param(const ParamDict& pd)
{
    w = pd.get(0, -233);
    h = pd.get(1, -233);
    c = pd.get(2, -233);
    permute = pd.get(3, 0);

    ndim = 3;
    if (c == -233)
        ndim = 2;
    if (h == -233)
        ndim = 1;
    if (w == -233)
        ndim = 0;

    return 0;
}